

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O0

tcache_t * tcache_create_explicit(tsd_t *tsd)

{
  byte bVar1;
  uint uVar2;
  rtree_t *rtree;
  long lVar3;
  rtree_ctx_t *prVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  arena_t *arena;
  tsd_t *in_RDI;
  size_t stack_offset;
  size_t size;
  tcache_t *tcache;
  size_t usize;
  void *ret_6;
  tsd_t *tsd_1;
  size_t ret_3;
  size_t ret_5;
  size_t ret;
  size_t ret_2;
  size_t usize_2;
  size_t delta_mask_1;
  size_t delta_1;
  size_t lg_delta_1;
  size_t x_1;
  size_t lg_ceil_1;
  size_t lg_tmin_1;
  size_t usize_1;
  size_t delta_mask;
  size_t delta;
  size_t lg_delta;
  size_t x;
  size_t lg_ceil;
  size_t lg_tmin;
  szind_t ret_1;
  szind_t ret_4;
  szind_t szind;
  rtree_ctx_t *rtree_ctx_1;
  rtree_ctx_t rtree_ctx_fallback_1;
  rtree_leaf_elm_t *elm_2;
  uint8_t state_2;
  rtree_leaf_elm_t *elm_3;
  uintptr_t bits_1;
  uintptr_t subkey_5;
  rtree_leaf_elm_t *leaf_5;
  uint i_1;
  uintptr_t subkey_4;
  rtree_leaf_elm_t *leaf_4;
  uintptr_t subkey_3;
  rtree_leaf_elm_t *leaf_3;
  uintptr_t leafkey_1;
  size_t slot_1;
  uint maskbits_5;
  uint cumbits_5;
  uint ptrbits_5;
  uintptr_t mask_4;
  uint maskbits_6;
  uint cumbits_6;
  uint ptrbits_6;
  uintptr_t mask_5;
  uint maskbits_7;
  uint shiftbits_3;
  uint cumbits_7;
  uint ptrbits_7;
  uintptr_t mask_6;
  uint maskbits_8;
  uint shiftbits_4;
  uint cumbits_8;
  uint ptrbits_8;
  uintptr_t mask_7;
  uint maskbits_9;
  uint shiftbits_5;
  uint cumbits_9;
  uint ptrbits_9;
  void *result_1;
  size_t ret_7;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  uint8_t state_1;
  rtree_leaf_elm_t *elm;
  rtree_leaf_elm_t *elm_1;
  uintptr_t subkey_2;
  rtree_leaf_elm_t *leaf_2;
  uint i;
  uintptr_t subkey_1;
  rtree_leaf_elm_t *leaf_1;
  uintptr_t subkey;
  rtree_leaf_elm_t *leaf;
  uintptr_t leafkey;
  size_t slot;
  uint maskbits;
  uint cumbits;
  uint ptrbits;
  uintptr_t mask;
  uint maskbits_1;
  uint cumbits_1;
  uint ptrbits_1;
  uintptr_t mask_1;
  uint maskbits_2;
  uint shiftbits;
  uint cumbits_2;
  uint ptrbits_2;
  uintptr_t mask_2;
  uint maskbits_3;
  uint shiftbits_1;
  uint cumbits_3;
  uint ptrbits_3;
  uintptr_t mask_3;
  uint maskbits_4;
  uint shiftbits_2;
  uint cumbits_4;
  uint ptrbits_4;
  uintptr_t bits;
  void *result;
  uint8_t state;
  arena_t *in_stack_fffffffffffff568;
  void *in_stack_fffffffffffff570;
  tcache_t *in_stack_fffffffffffff578;
  undefined4 in_stack_fffffffffffff580;
  int in_stack_fffffffffffff584;
  undefined8 in_stack_fffffffffffff588;
  tsdn_t *in_stack_fffffffffffff590;
  tcache_t *in_stack_fffffffffffff5a8;
  undefined8 in_stack_fffffffffffff5b0;
  undefined1 zero;
  tsd_t *ptVar8;
  tsd_t *alignment;
  arena_t *in_stack_fffffffffffff5c8;
  rtree_ctx_t *in_stack_fffffffffffff5d0;
  undefined2 uVar9;
  uintptr_t in_stack_fffffffffffff5d8;
  rtree_ctx_t *in_stack_fffffffffffff5e0;
  tcache_t *local_9f8;
  rtree_ctx_t *local_9e0;
  rtree_ctx_t *local_9c8;
  witness_tsd_t *local_970;
  rtree_ctx_t *local_950;
  rtree_ctx_t *local_940;
  rtree_ctx_t *local_8c0;
  rtree_ctx_t *local_8b8;
  ulong local_878;
  rtree_ctx_t *local_870;
  rtree_ctx_t local_818;
  tcache_t *local_698;
  tsd_t *local_690;
  rtree_ctx_t *local_688;
  rtree_ctx_t *local_678;
  rtree_leaf_elm_t *local_670;
  byte local_661;
  tcache_t *local_660;
  rtree_ctx_t *local_658;
  rtree_t *local_650;
  tsd_t *local_648;
  uint local_640;
  uint local_63c;
  uint8_t local_619;
  rtree_leaf_elm_t *local_600;
  byte local_5f1;
  tcache_t *local_5f0;
  rtree_ctx_t *local_5e8;
  rtree_t *local_5e0;
  tsd_t *local_5d8;
  rtree_leaf_elm_t *local_5d0;
  void *local_5c8;
  byte local_5b9;
  rtree_leaf_elm_t *local_5b8;
  rtree_t *local_5b0;
  tsd_t *local_5a8;
  ulong local_5a0;
  rtree_leaf_elm_t *local_598;
  uint local_58c;
  ulong local_588;
  rtree_leaf_elm_t *local_580;
  ulong local_578;
  rtree_leaf_elm_t *local_570;
  uintptr_t local_568;
  ulong local_560;
  undefined1 local_552;
  undefined1 local_551;
  tcache_t *local_550;
  rtree_ctx_t *local_548;
  rtree_t *local_540;
  tsd_t *local_538;
  rtree_leaf_elm_t *local_530;
  undefined4 local_524;
  undefined4 local_520;
  undefined4 local_51c;
  tcache_t *local_518;
  undefined8 local_510;
  undefined4 local_504;
  undefined4 local_500;
  undefined4 local_4fc;
  tcache_t *local_4f8;
  undefined8 local_4f0;
  uint local_4e4;
  undefined4 local_4e0;
  uint local_4dc;
  undefined4 local_4d8;
  undefined4 local_4d4;
  tcache_t *local_4d0;
  undefined8 local_4c8;
  uint local_4bc;
  undefined4 local_4b8;
  uint local_4b4;
  undefined4 local_4b0;
  undefined4 local_4ac;
  tcache_t *local_4a8;
  undefined8 local_4a0;
  uint local_494;
  undefined4 local_490;
  uint local_48c;
  undefined4 local_488;
  undefined4 local_484;
  tcache_t *local_480;
  byte local_471;
  rtree_leaf_elm_t *local_470;
  rtree_t *local_468;
  tsd_t *local_460;
  void *local_458;
  void *local_450;
  uint local_444;
  rtree_leaf_elm_t *local_440;
  uint local_438;
  int local_434;
  size_t local_430;
  uint local_424;
  tcache_t *local_420;
  rtree_ctx_t *local_410;
  rtree_ctx_t local_408;
  tcache_t *local_288;
  tsd_t *local_280;
  rtree_ctx_t *local_278;
  rtree_ctx_t *local_268;
  uint8_t local_241;
  rtree_leaf_elm_t *local_228;
  byte local_219;
  tcache_t *local_218;
  rtree_ctx_t *local_210;
  rtree_t *local_208;
  tsd_t *local_200;
  ulong local_1f8;
  rtree_leaf_elm_t *local_1f0;
  byte local_1e1;
  tcache_t *local_1e0;
  rtree_ctx_t *local_1d8;
  rtree_t *local_1d0;
  tsd_t *local_1c8;
  rtree_leaf_elm_t *local_1c0;
  ulong local_1b8;
  rtree_leaf_elm_t *local_1b0;
  uint local_1a4;
  ulong local_1a0;
  rtree_leaf_elm_t *local_198;
  ulong local_190;
  rtree_leaf_elm_t *local_188;
  uintptr_t local_180;
  ulong local_178;
  undefined1 local_16a;
  undefined1 local_169;
  tcache_t *local_168;
  rtree_ctx_t *local_160;
  rtree_t *local_158;
  tsd_t *local_150;
  rtree_leaf_elm_t *local_148;
  undefined4 local_13c;
  undefined4 local_138;
  undefined4 local_134;
  tcache_t *local_130;
  undefined8 local_128;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  tcache_t *local_110;
  undefined8 local_108;
  uint local_fc;
  undefined4 local_f8;
  uint local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  tcache_t *local_e8;
  undefined8 local_e0;
  uint local_d4;
  undefined4 local_d0;
  uint local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  tcache_t *local_c0;
  undefined8 local_b8;
  uint local_ac;
  undefined4 local_a8;
  uint local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  tcache_t *local_98;
  void *local_90;
  byte local_81;
  rtree_leaf_elm_t *local_80;
  rtree_t *local_78;
  tsd_t *local_70;
  byte local_61;
  rtree_leaf_elm_t *local_60;
  rtree_t *local_58;
  tsd_t *local_50;
  void *local_48;
  uint local_3c;
  rtree_leaf_elm_t *local_38;
  uint local_30;
  int local_2c;
  void *local_28;
  uint8_t local_19;
  
  zero = (undefined1)((ulong)in_stack_fffffffffffff5b0 >> 0x38);
  rtree = (rtree_t *)0x1648;
  lVar3 = (ulong)stack_nelms * 8;
  prVar4 = (rtree_ctx_t *)(lVar3 + 0x1648);
  if (prVar4 < (rtree_ctx_t *)0x3801) {
    local_878 = lVar3 + 0x1687U & 0xffffffffffffffc0;
    if (local_878 < 0x1001) {
      local_950 = (rtree_ctx_t *)sz_index2size_tab[sz_size2index_tab[local_878 + 7 >> 3]];
    }
    else {
      if (local_878 < 0x7000000000000001) {
        if (local_878 == 0) {
          local_878 = 1;
        }
        if (local_878 < 9) {
          sVar5 = pow2_ceil_zu(0x26a254);
          uVar2 = lg_floor(sVar5);
          if (uVar2 < 3) {
            bVar1 = 3;
          }
          else {
            bVar1 = (byte)uVar2 & 0x3f;
          }
          in_stack_fffffffffffff5e0 = (rtree_ctx_t *)(1L << bVar1);
          local_870 = in_stack_fffffffffffff5e0;
        }
        else {
          uVar2 = lg_floor(local_878 * 2 - 1);
          if ((ulong)uVar2 < 7) {
            in_stack_fffffffffffff5d8 = 4;
          }
          else {
            in_stack_fffffffffffff5d8 = (ulong)uVar2 - 3;
          }
          uVar6 = (1L << ((byte)in_stack_fffffffffffff5d8 & 0x3f)) - 1;
          local_870 = (rtree_ctx_t *)(local_878 + uVar6 & (uVar6 ^ 0xffffffffffffffff));
        }
      }
      else {
        local_870 = (rtree_ctx_t *)0x0;
      }
      local_950 = local_870;
    }
    if (local_950 < (rtree_ctx_t *)0x4000) {
      local_9c8 = local_950;
      goto LAB_0026a6ef;
    }
  }
  if (prVar4 < (rtree_ctx_t *)0x4001) {
    local_9e0 = (rtree_ctx_t *)0x4000;
  }
  else {
    if (prVar4 < (rtree_ctx_t *)0x1001) {
      local_940 = (rtree_ctx_t *)sz_index2size_tab[sz_size2index_tab[lVar3 + 0x164fU >> 3]];
    }
    else {
      if (prVar4 < (rtree_ctx_t *)0x7000000000000001) {
        local_8c0 = prVar4;
        if (prVar4 == (rtree_ctx_t *)0x0) {
          local_8c0 = (rtree_ctx_t *)(lVar3 + 0x1649);
        }
        if (local_8c0 < (rtree_ctx_t *)0x9) {
          sVar5 = pow2_ceil_zu(0x26a53c);
          uVar2 = lg_floor(sVar5);
          if (uVar2 < 3) {
            bVar1 = 3;
          }
          else {
            bVar1 = (byte)uVar2 & 0x3f;
          }
          in_stack_fffffffffffff5d0 = (rtree_ctx_t *)(1L << bVar1);
          local_8b8 = in_stack_fffffffffffff5d0;
        }
        else {
          uVar2 = lg_floor((long)local_8c0 * 2 - 1);
          if ((ulong)uVar2 < 7) {
            in_stack_fffffffffffff5c8 = (arena_t *)0x4;
          }
          else {
            in_stack_fffffffffffff5c8 = (arena_t *)((ulong)uVar2 - 3);
          }
          lVar3 = 1L << ((byte)in_stack_fffffffffffff5c8 & 0x3f);
          local_8b8 = (rtree_ctx_t *)
                      ((long)(((tsd_t *)local_8c0->cache)->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache
                       + lVar3 + -0x31 & (lVar3 - 1U ^ 0xffffffffffffffff));
        }
      }
      else {
        local_8b8 = (rtree_ctx_t *)0x0;
      }
      local_940 = local_8b8;
    }
    local_9e0 = local_940;
    if (local_940 < prVar4) {
      local_9c8 = (rtree_ctx_t *)0x0;
      goto LAB_0026a6ef;
    }
  }
  if (local_9e0[10].l2_cache < local_9e0) {
    local_9c8 = (rtree_ctx_t *)0x0;
  }
  else {
    local_9c8 = local_9e0;
  }
LAB_0026a6ef:
  ptVar8 = in_RDI;
  prVar4 = local_9c8;
  arena_get(in_stack_fffffffffffff590,(uint)((ulong)in_stack_fffffffffffff588 >> 0x20),
            SUB81((ulong)in_stack_fffffffffffff588 >> 0x18,0));
  if (ptVar8 == (tsd_t *)0x0) {
    local_970 = (witness_tsd_t *)0x0;
  }
  else {
    local_19 = (ptVar8->state).repr;
    local_970 = &ptVar8->cant_access_tsd_items_directly_use_a_getter_or_setter_witness_tsd;
  }
  alignment = ptVar8;
  witness_assert_depth_to_rank((witness_tsdn_t *)local_970,0xc,0);
  local_9f8 = (tcache_t *)
              arena_palloc((tsdn_t *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8,
                           (size_t)local_9c8,(size_t)alignment,(_Bool)zero,in_stack_fffffffffffff5a8
                          );
  uVar9 = (undefined2)((ulong)in_stack_fffffffffffff5d0 >> 0x30);
  if (local_9f8 != (tcache_t *)0x0) {
    local_278 = &local_408;
    local_420 = local_9f8;
    local_288 = local_9f8;
    local_280 = ptVar8;
    if (ptVar8 == (tsd_t *)0x0) {
      rtree_ctx_data_init(local_278);
      local_268 = local_278;
    }
    else {
      local_241 = (ptVar8->state).repr;
      local_268 = &ptVar8->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    local_410 = local_268;
    local_200 = local_280;
    local_208 = &extents_rtree;
    local_210 = local_268;
    local_218 = local_288;
    local_219 = 1;
    local_1c8 = local_280;
    local_1d0 = &extents_rtree;
    local_1d8 = local_268;
    local_1e0 = local_288;
    local_1e1 = 1;
    local_150 = local_280;
    local_158 = &extents_rtree;
    local_160 = local_268;
    local_168 = local_288;
    local_169 = 1;
    local_16a = 0;
    local_130 = local_288;
    local_134 = 0x40;
    local_138 = 0x22;
    local_13c = 0x1e;
    uVar6 = (ulong)local_288 >> 0x1e & 0xf;
    local_110 = local_288;
    local_114 = 0x40;
    local_118 = 0x22;
    local_11c = 0x1e;
    local_128 = 0xffffffffc0000000;
    uVar7 = (ulong)local_288 & 0xffffffffc0000000;
    local_180 = uVar7;
    local_178 = uVar6;
    if (local_268->cache[uVar6].leafkey == uVar7) {
      local_188 = local_268->cache[uVar6].leaf;
      local_e8 = local_288;
      local_ec = 1;
      local_f0 = 0x40;
      local_f4 = 0x34;
      local_f8 = 0xc;
      local_fc = 0x12;
      local_108 = 0x3ffff;
      local_190 = (ulong)local_288 >> 0xc & 0x3ffff;
      local_148 = local_188 + local_190;
    }
    else if (local_268->l2_cache[0].leafkey == uVar7) {
      local_198 = local_268->l2_cache[0].leaf;
      local_268->l2_cache[0].leafkey = local_268->cache[uVar6].leafkey;
      local_160->l2_cache[0].leaf = local_160->cache[local_178].leaf;
      local_160->cache[local_178].leafkey = local_180;
      local_160->cache[local_178].leaf = local_198;
      local_c0 = local_168;
      local_c4 = 1;
      local_c8 = 0x40;
      local_cc = 0x34;
      local_d0 = 0xc;
      local_d4 = 0x12;
      local_e0 = 0x3ffff;
      local_1a0 = (ulong)local_168 >> 0xc & 0x3ffff;
      local_148 = local_198 + local_1a0;
    }
    else {
      for (local_1a4 = 1; local_1a4 < 8; local_1a4 = local_1a4 + 1) {
        if (local_268->l2_cache[local_1a4].leafkey == uVar7) {
          local_1b0 = local_268->l2_cache[local_1a4].leaf;
          if (local_1a4 == 0) {
            local_268->l2_cache[0].leafkey = local_268->cache[uVar6].leafkey;
            local_160->l2_cache[0].leaf = local_160->cache[local_178].leaf;
          }
          else {
            local_268->l2_cache[local_1a4].leafkey = local_268->l2_cache[local_1a4 - 1].leafkey;
            local_268->l2_cache[local_1a4].leaf = local_268->l2_cache[local_1a4 - 1].leaf;
            local_268->l2_cache[local_1a4 - 1].leafkey = local_268->cache[uVar6].leafkey;
            local_268->l2_cache[local_1a4 - 1].leaf = local_268->cache[uVar6].leaf;
          }
          local_160->cache[local_178].leafkey = local_180;
          local_160->cache[local_178].leaf = local_1b0;
          local_98 = local_168;
          local_9c = 1;
          local_a0 = 0x40;
          local_a4 = 0x34;
          local_a8 = 0xc;
          local_ac = 0x12;
          local_b8 = 0x3ffff;
          local_1b8 = (ulong)local_168 >> 0xc & 0x3ffff;
          local_148 = local_1b0 + local_1b8;
          goto LAB_0026b1c9;
        }
      }
      local_148 = rtree_leaf_elm_lookup_hard
                            ((tsdn_t *)prVar4,rtree,in_stack_fffffffffffff5e0,
                             in_stack_fffffffffffff5d8,SUB21((ushort)uVar9 >> 8,0),SUB21(uVar9,0));
    }
LAB_0026b1c9:
    local_1f0 = local_148;
    if (((local_1e1 & 1) == 0) && (local_148 == (rtree_leaf_elm_t *)0x0)) {
      local_1c0 = (rtree_leaf_elm_t *)0x0;
    }
    else {
      local_1c0 = local_148;
    }
    local_228 = local_1c0;
    if (((local_219 & 1) == 0) && (local_1c0 == (rtree_leaf_elm_t *)0x0)) {
      local_1f8 = 0;
    }
    else {
      local_70 = local_200;
      local_78 = local_208;
      local_80 = local_1c0;
      local_81 = local_219 & 1;
      local_50 = local_200;
      local_58 = local_208;
      local_60 = local_1c0;
      local_3c = (byte)~local_81 & 1;
      local_38 = local_1c0;
      switch(local_3c) {
      case 0:
        local_2c = 0;
        break;
      case 1:
        local_2c = 2;
      }
      if (local_2c - 1U < 2) {
        local_48 = (local_1c0->le_bits).repr;
      }
      else if (local_2c == 5) {
        local_48 = (local_1c0->le_bits).repr;
      }
      else {
        local_48 = (local_1c0->le_bits).repr;
      }
      local_90 = local_48;
      local_28 = local_48;
      local_1f8 = ((long)local_48 << 0x10) >> 0x10 & 0xfffffffffffffffe;
      local_61 = local_81;
      local_30 = local_3c;
    }
    arena = extent_arena_get((extent_t *)
                             CONCAT44(in_stack_fffffffffffff584,in_stack_fffffffffffff580));
    local_688 = &local_818;
    local_698 = local_9f8;
    local_690 = ptVar8;
    if (ptVar8 == (tsd_t *)0x0) {
      rtree_ctx_data_init(local_688);
      local_678 = local_688;
    }
    else {
      local_619 = (ptVar8->state).repr;
      local_678 = &ptVar8->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    local_648 = local_690;
    local_650 = &extents_rtree;
    local_658 = local_678;
    local_660 = local_698;
    local_661 = 1;
    local_5d8 = local_690;
    local_5e0 = &extents_rtree;
    local_5e8 = local_678;
    local_5f0 = local_698;
    local_5f1 = 1;
    local_538 = local_690;
    local_540 = &extents_rtree;
    local_548 = local_678;
    local_550 = local_698;
    local_551 = 1;
    local_552 = 0;
    local_518 = local_698;
    local_51c = 0x40;
    local_520 = 0x22;
    local_524 = 0x1e;
    uVar6 = (ulong)local_698 >> 0x1e & 0xf;
    local_4f8 = local_698;
    local_4fc = 0x40;
    local_500 = 0x22;
    local_504 = 0x1e;
    local_510 = 0xffffffffc0000000;
    uVar7 = (ulong)local_698 & 0xffffffffc0000000;
    local_568 = uVar7;
    local_560 = uVar6;
    if (local_678->cache[uVar6].leafkey == uVar7) {
      local_570 = local_678->cache[uVar6].leaf;
      local_4d0 = local_698;
      local_4d4 = 1;
      local_4d8 = 0x40;
      local_4dc = 0x34;
      local_4e0 = 0xc;
      local_4e4 = 0x12;
      local_4f0 = 0x3ffff;
      local_578 = (ulong)local_698 >> 0xc & 0x3ffff;
      local_530 = local_570 + local_578;
    }
    else if (local_678->l2_cache[0].leafkey == uVar7) {
      local_580 = local_678->l2_cache[0].leaf;
      local_678->l2_cache[0].leafkey = local_678->cache[uVar6].leafkey;
      local_548->l2_cache[0].leaf = local_548->cache[local_560].leaf;
      local_548->cache[local_560].leafkey = local_568;
      local_548->cache[local_560].leaf = local_580;
      local_4a8 = local_550;
      local_4ac = 1;
      local_4b0 = 0x40;
      local_4b4 = 0x34;
      local_4b8 = 0xc;
      local_4bc = 0x12;
      local_4c8 = 0x3ffff;
      local_588 = (ulong)local_550 >> 0xc & 0x3ffff;
      local_530 = local_580 + local_588;
    }
    else {
      for (local_58c = 1; local_58c < 8; local_58c = local_58c + 1) {
        if (local_678->l2_cache[local_58c].leafkey == uVar7) {
          local_598 = local_678->l2_cache[local_58c].leaf;
          if (local_58c == 0) {
            local_678->l2_cache[0].leafkey = local_678->cache[uVar6].leafkey;
            local_548->l2_cache[0].leaf = local_548->cache[local_560].leaf;
          }
          else {
            local_678->l2_cache[local_58c].leafkey = local_678->l2_cache[local_58c - 1].leafkey;
            local_678->l2_cache[local_58c].leaf = local_678->l2_cache[local_58c - 1].leaf;
            local_678->l2_cache[local_58c - 1].leafkey = local_678->cache[uVar6].leafkey;
            local_678->l2_cache[local_58c - 1].leaf = local_678->cache[uVar6].leaf;
          }
          local_548->cache[local_560].leafkey = local_568;
          local_548->cache[local_560].leaf = local_598;
          local_480 = local_550;
          local_484 = 1;
          local_488 = 0x40;
          local_48c = 0x34;
          local_490 = 0xc;
          local_494 = 0x12;
          local_4a0 = 0x3ffff;
          local_5a0 = (ulong)local_550 >> 0xc & 0x3ffff;
          local_530 = local_598 + local_5a0;
          goto LAB_0026bd03;
        }
      }
      local_530 = rtree_leaf_elm_lookup_hard
                            ((tsdn_t *)prVar4,rtree,in_stack_fffffffffffff5e0,
                             in_stack_fffffffffffff5d8,SUB21((ushort)uVar9 >> 8,0),SUB21(uVar9,0));
    }
LAB_0026bd03:
    local_600 = local_530;
    if (((local_5f1 & 1) == 0) && (local_530 == (rtree_leaf_elm_t *)0x0)) {
      local_5d0 = (rtree_leaf_elm_t *)0x0;
    }
    else {
      local_5d0 = local_530;
    }
    local_670 = local_5d0;
    if (((local_661 & 1) == 0) && (local_5d0 == (rtree_leaf_elm_t *)0x0)) {
      local_640 = 0xe8;
    }
    else {
      local_5a8 = local_648;
      local_5b0 = local_650;
      local_5b8 = local_5d0;
      local_5b9 = local_661 & 1;
      local_460 = local_648;
      local_468 = local_650;
      local_470 = local_5d0;
      local_444 = (byte)~local_5b9 & 1;
      local_440 = local_5d0;
      switch(local_444) {
      case 0:
        local_434 = 0;
        break;
      case 1:
        local_434 = 2;
      }
      if (local_434 - 1U < 2) {
        local_450 = (local_5d0->le_bits).repr;
      }
      else if (local_434 == 5) {
        local_450 = (local_5d0->le_bits).repr;
      }
      else {
        local_450 = (local_5d0->le_bits).repr;
      }
      local_5c8 = local_450;
      local_458 = local_450;
      local_640 = (uint)(ushort)((ulong)local_450 >> 0x30);
      in_stack_fffffffffffff584 = local_434;
      local_471 = local_5b9;
      local_438 = local_444;
    }
    local_63c = local_640;
    local_424 = local_640;
    local_430 = sz_index2size_tab[local_640];
    arena_internal_add(arena,local_430);
  }
  if (local_9f8 == (tcache_t *)0x0) {
    local_9f8 = (tcache_t *)0x0;
  }
  else {
    tcache_init((tsd_t *)CONCAT44(in_stack_fffffffffffff584,in_stack_fffffffffffff580),
                in_stack_fffffffffffff578,in_stack_fffffffffffff570);
    arena_ichoose(in_RDI,in_stack_fffffffffffff568);
    tcache_arena_associate
              ((tsdn_t *)in_RDI,(tcache_t *)in_stack_fffffffffffff568,(arena_t *)0x26c01a);
  }
  return local_9f8;
}

Assistant:

tcache_t *
tcache_create_explicit(tsd_t *tsd) {
	tcache_t *tcache;
	size_t size, stack_offset;

	size = sizeof(tcache_t);
	/* Naturally align the pointer stacks. */
	size = PTR_CEILING(size);
	stack_offset = size;
	size += stack_nelms * sizeof(void *);
	/* Avoid false cacheline sharing. */
	size = sz_sa2u(size, CACHELINE);

	tcache = ipallocztm(tsd_tsdn(tsd), size, CACHELINE, true, NULL, true,
	    arena_get(TSDN_NULL, 0, true));
	if (tcache == NULL) {
		return NULL;
	}

	tcache_init(tsd, tcache,
	    (void *)((uintptr_t)tcache + (uintptr_t)stack_offset));
	tcache_arena_associate(tsd_tsdn(tsd), tcache, arena_ichoose(tsd, NULL));

	return tcache;
}